

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::setAmountOnEachBtc(wallet *this,linkedList<int> *amountOnEachBtc)

{
  linkedList<int> *amountOnEachBtc_local;
  wallet *this_local;
  
  linkedList<int>::operator=(&this->amountOnEachBtc,amountOnEachBtc);
  return;
}

Assistant:

void wallet::setAmountOnEachBtc( linkedList<int> &amountOnEachBtc) {
    wallet::amountOnEachBtc = amountOnEachBtc;
}